

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandPermute(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Abc_Ntk_t *pNtk_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  int c;
  int fFanout;
  int fNodes;
  int fFlops;
  int fOutputs;
  int fInputs;
  char *pFlopPermFile;
  Abc_Ntk_t *pNtkRes;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk_00 = pAbc->pNtkCur;
  _fOutputs = (char *)0x0;
  fFlops = 1;
  fNodes = 1;
  fFanout = 1;
  bVar2 = true;
  bVar1 = false;
  Extra_UtilGetoptReset();
LAB_0024aa89:
  iVar3 = Extra_UtilGetopt(argc,argv,"Fiofnxh");
  if (iVar3 == -1) {
    if (pNtk_00 == (Abc_Ntk_t *)0x0) {
      Abc_Print(-1,"Empty network.\n");
      pAbc_local._4_4_ = 1;
    }
    else if (bVar1) {
      iVar3 = Abc_NtkLatchNum(pNtk_00);
      if (iVar3 == 0) {
        Abc_NtkPermutePiUsingFanout(pNtk_00);
        pAbc_local._4_4_ = 0;
      }
      else {
        Abc_Print(-1,"Currently \"permute -x\" works only for combinational networks.\n");
        pAbc_local._4_4_ = 1;
      }
    }
    else if ((bVar2) && (iVar3 = Abc_NtkIsStrash(pNtk_00), iVar3 == 0)) {
      Abc_Print(-1,"To permute nodes, the network should be structurally hashed.\n");
      pAbc_local._4_4_ = 1;
    }
    else {
      if (bVar2) {
        pFlopPermFile = (char *)Abc_NtkRestrashRandom(pNtk_00);
      }
      else {
        pFlopPermFile = (char *)Abc_NtkDup(pNtk_00);
      }
      if (pFlopPermFile == (char *)0x0) {
        Abc_Print(-1,"Command \"permute\" has failed.\n");
        pAbc_local._4_4_ = 1;
      }
      else {
        Abc_NtkPermute((Abc_Ntk_t *)pFlopPermFile,fFlops,fNodes,fFanout,_fOutputs);
        Abc_FrameReplaceCurrentNetwork(pAbc,(Abc_Ntk_t *)pFlopPermFile);
        pAbc_local._4_4_ = 0;
      }
    }
    return pAbc_local._4_4_;
  }
  switch(iVar3) {
  case 0x46:
    if (globalUtilOptind < argc) {
      _fOutputs = argv[globalUtilOptind];
      globalUtilOptind = globalUtilOptind + 1;
      goto LAB_0024aa89;
    }
    Abc_Print(-1,"Command line switch \"-F\" should be followed by a file name.\n");
    break;
  default:
    Abc_Print(-2,"Unknown switch.\n");
    break;
  case 0x66:
    fFanout = fFanout ^ 1;
    goto LAB_0024aa89;
  case 0x68:
    break;
  case 0x69:
    fFlops = fFlops ^ 1;
    goto LAB_0024aa89;
  case 0x6e:
    bVar2 = (bool)(bVar2 ^ 1);
    goto LAB_0024aa89;
  case 0x6f:
    fNodes = fNodes ^ 1;
    goto LAB_0024aa89;
  case 0x78:
    goto switchD_0024aacf_caseD_78;
  }
  Abc_Print(-2,"usage: permute [-iofnxh] [-F filename]\n");
  Abc_Print(-2,"\t                performs random permutation of inputs/outputs/flops\n");
  pcVar4 = "no";
  if (fFlops != 0) {
    pcVar4 = "yes";
  }
  Abc_Print(-2,"\t-i            : toggle permuting primary inputs [default = %s]\n",pcVar4);
  pcVar4 = "no";
  if (fNodes != 0) {
    pcVar4 = "yes";
  }
  Abc_Print(-2,"\t-o            : toggle permuting primary outputs [default = %s]\n",pcVar4);
  pcVar4 = "no";
  if (fFanout != 0) {
    pcVar4 = "yes";
  }
  Abc_Print(-2,"\t-f            : toggle permuting flip-flops [default = %s]\n",pcVar4);
  pcVar4 = "no";
  if (bVar2) {
    pcVar4 = "yes";
  }
  Abc_Print(-2,
            "\t-n            : toggle deriving new topological ordering of nodes [default = %s]\n",
            pcVar4);
  pcVar4 = "no";
  if (bVar1) {
    pcVar4 = "yes";
  }
  Abc_Print(-2,
            "\t-x            : toggle permuting inputs based on their fanout count [default = %s]\n"
            ,pcVar4);
  Abc_Print(-2,"\t-h            : print the command usage\n");
  Abc_Print(-2,"\t-F <filename> : (optional) file with the flop permutation\n");
  return 1;
switchD_0024aacf_caseD_78:
  bVar1 = (bool)(bVar1 ^ 1);
  goto LAB_0024aa89;
}

Assistant:

int Abc_CommandPermute( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Abc_Ntk_t * Abc_NtkRestrashRandom( Abc_Ntk_t * pNtk );
    extern void Abc_NtkPermutePiUsingFanout( Abc_Ntk_t * pNtk );
    Abc_Ntk_t * pNtk = pAbc->pNtkCur, * pNtkRes = NULL;
    char * pFlopPermFile = NULL;
    int fInputs = 1;
    int fOutputs = 1;
    int fFlops = 1;
    int fNodes = 1;
    int fFanout = 0;
    int c;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Fiofnxh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by a file name.\n" );
                goto usage;
            }
            pFlopPermFile = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'i':
            fInputs ^= 1;
            break;
        case 'o':
            fOutputs ^= 1;
            break;
        case 'f':
            fFlops ^= 1;
            break;
        case 'n':
            fNodes ^= 1;
            break;
        case 'x':
            fFanout ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            Abc_Print( -2, "Unknown switch.\n");
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( fFanout )
    {
        if ( Abc_NtkLatchNum(pNtk) )
        {
            Abc_Print( -1, "Currently \"permute -x\" works only for combinational networks.\n" );
            return 1;
        }
        Abc_NtkPermutePiUsingFanout( pNtk );
        return 0;
    }
    if ( fNodes && !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "To permute nodes, the network should be structurally hashed.\n" );
        return 1;
    }
    if ( fNodes )
        pNtkRes = Abc_NtkRestrashRandom( pNtk );
    else
        pNtkRes = Abc_NtkDup( pNtk );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Command \"permute\" has failed.\n" );
        return 1;
    }
    Abc_NtkPermute( pNtkRes, fInputs, fOutputs, fFlops, pFlopPermFile );
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: permute [-iofnxh] [-F filename]\n" );
    Abc_Print( -2, "\t                performs random permutation of inputs/outputs/flops\n" );
    Abc_Print( -2, "\t-i            : toggle permuting primary inputs [default = %s]\n", fInputs? "yes": "no" );
    Abc_Print( -2, "\t-o            : toggle permuting primary outputs [default = %s]\n", fOutputs? "yes": "no" );
    Abc_Print( -2, "\t-f            : toggle permuting flip-flops [default = %s]\n", fFlops? "yes": "no" );
    Abc_Print( -2, "\t-n            : toggle deriving new topological ordering of nodes [default = %s]\n", fNodes? "yes": "no" );
    Abc_Print( -2, "\t-x            : toggle permuting inputs based on their fanout count [default = %s]\n", fFanout? "yes": "no" );
    Abc_Print( -2, "\t-h            : print the command usage\n");
    Abc_Print( -2, "\t-F <filename> : (optional) file with the flop permutation\n" );
    return 1;
}